

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureBase.cpp
# Opt level: O1

void Diligent::ValidatedAndCorrectTextureViewDesc(TextureDesc *TexDesc,TextureViewDesc *ViewDesc)

{
  Uint32 *Args_6;
  Uint32 *Args_8;
  anon_union_4_2_fd7742d7_for_TextureViewDesc_6 *Args_6_00;
  anon_union_4_2_715f406a_for_TextureDesc_4 *Args_8_00;
  RESOURCE_DIMENSION RVar1;
  bool bVar2;
  TEXTURE_FORMAT TVar3;
  Uint32 UVar4;
  uint uVar5;
  char *pcVar6;
  TextureFormatAttribs *pTVar7;
  int Line;
  char (*Args_1) [194];
  string msg;
  Uint32 MipDepth;
  undefined4 uStack_3c;
  Uint32 *local_38;
  
  if (5 < (byte)(ViewDesc->ViewType - TEXTURE_VIEW_SHADER_RESOURCE)) {
    pcVar6 = (ViewDesc->super_DeviceObjectAttribs).Name;
    msg._M_dataplus._M_p = "";
    if (pcVar6 != (char *)0x0) {
      msg._M_dataplus._M_p = pcVar6;
    }
    LogError<true,char[50],char_const*,char[16],char_const*,char[4],char[36]>
              (false,"ValidatedAndCorrectTextureViewDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
               ,0x1e8,(char (*) [50])"\n                 Failed to create texture view \'",
               (char **)&msg,(char (*) [16])"\' for texture \'",(char **)TexDesc,
               (char (*) [4])"\': ",(char (*) [36])"Texture view type is not specified.");
  }
  Args_6 = &ViewDesc->MostDetailedMip;
  Args_8 = &TexDesc->MipLevels;
  if (TexDesc->MipLevels <= ViewDesc->MostDetailedMip) {
    pcVar6 = (ViewDesc->super_DeviceObjectAttribs).Name;
    msg._M_dataplus._M_p = "";
    if (pcVar6 != (char *)0x0) {
      msg._M_dataplus._M_p = pcVar6;
    }
    _MipDepth = "level.";
    if (1 < TexDesc->MipLevels) {
      _MipDepth = "levels.";
    }
    LogError<true,char[50],char_const*,char[16],char_const*,char[4],char[20],unsigned_int,char[41],unsigned_int,char[6],char_const*>
              (false,"ValidatedAndCorrectTextureViewDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
               ,0x1eb,(char (*) [50])"\n                 Failed to create texture view \'",
               (char **)&msg,(char (*) [16])"\' for texture \'",(char **)TexDesc,
               (char (*) [4])"\': ",(char (*) [20])"Most detailed mip (",Args_6,
               (char (*) [41])") is out of range. The texture has only ",Args_8,
               (char (*) [6])0x76970d,(char **)&MipDepth);
  }
  local_38 = &ViewDesc->NumMipLevels;
  if ((ViewDesc->NumMipLevels != 0xffffffff) && (*Args_8 < ViewDesc->NumMipLevels + *Args_6)) {
    pcVar6 = (ViewDesc->super_DeviceObjectAttribs).Name;
    msg._M_dataplus._M_p = "";
    if (pcVar6 != (char *)0x0) {
      msg._M_dataplus._M_p = pcVar6;
    }
    _MipDepth = "level.";
    if (1 < *Args_8) {
      _MipDepth = "levels.";
    }
    LogError<true,char[50],char_const*,char[16],char_const*,char[4],char[20],unsigned_int,char[41],unsigned_int,char[41],unsigned_int,char[6],char_const*>
              (false,"ValidatedAndCorrectTextureViewDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
               ,0x1ee,(char (*) [50])"\n                 Failed to create texture view \'",
               (char **)&msg,(char (*) [16])"\' for texture \'",(char **)TexDesc,
               (char (*) [4])"\': ",(char (*) [20])"Most detailed mip (",Args_6,
               (char (*) [41])") and number of mip levels in the view (",local_38,
               (char (*) [41])") is out of range. The texture has only ",Args_8,
               (char (*) [6])0x76970d,(char **)&MipDepth);
  }
  if (ViewDesc->Format == TEX_FORMAT_UNKNOWN) {
    TVar3 = GetDefaultTextureViewFormat(TexDesc->Format,ViewDesc->ViewType,TexDesc->BindFlags);
    ViewDesc->Format = TVar3;
  }
  RVar1 = TexDesc->Type;
  if ((RVar1 < 9) && ((0x1a8U >> (RVar1 & 0x1f) & 1) != 0)) {
    Args_6_00 = &ViewDesc->field_5;
    Args_8_00 = &TexDesc->field_3;
    if ((TexDesc->field_3).ArraySize <= (ViewDesc->field_5).FirstArraySlice) {
      pcVar6 = (ViewDesc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar6 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar6;
      }
      LogError<true,char[50],char_const*,char[16],char_const*,char[4],char[20],unsigned_int,char[42],unsigned_int,char[10]>
                (false,"ValidatedAndCorrectTextureViewDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x1f6,(char (*) [50])"\n                 Failed to create texture view \'",
                 (char **)&msg,(char (*) [16])"\' for texture \'",(char **)TexDesc,
                 (char (*) [4])"\': ",(char (*) [20])"First array slice (",
                 &Args_6_00->FirstArraySlice,
                 (char (*) [42])") is out of range. The texture has only (",&Args_8_00->ArraySize,
                 (char (*) [10])") slices.");
    }
    if (((ViewDesc->field_6).NumArraySlices != 0xffffffff) &&
       (Args_8_00->ArraySize < (ViewDesc->field_6).NumArraySlices + Args_6_00->FirstArraySlice)) {
      pcVar6 = (ViewDesc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar6 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar6;
      }
      LogError<true,char[50],char_const*,char[16],char_const*,char[4],char[20],unsigned_int,char[31],unsigned_int,char[42],unsigned_int,char[10]>
                (false,"ValidatedAndCorrectTextureViewDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x1fa,(char (*) [50])"\n                 Failed to create texture view \'",
                 (char **)&msg,(char (*) [16])"\' for texture \'",(char **)TexDesc,
                 (char (*) [4])"\': ",(char (*) [20])"First array slice (",
                 &Args_6_00->FirstArraySlice,(char (*) [31])") and number of array slices (",
                 &(ViewDesc->field_6).NumArraySlices,
                 (char (*) [42])") is out of range. The texture has only (",&Args_8_00->ArraySize,
                 (char (*) [10])") slices.");
    }
  }
  else if ((RVar1 != RESOURCE_DIM_TEX_3D) && ((ViewDesc->field_5).FirstArraySlice != 0)) {
    pcVar6 = (ViewDesc->super_DeviceObjectAttribs).Name;
    msg._M_dataplus._M_p = "";
    if (pcVar6 != (char *)0x0) {
      msg._M_dataplus._M_p = pcVar6;
    }
    LogError<true,char[50],char_const*,char[16],char_const*,char[4],char[48]>
              (false,"ValidatedAndCorrectTextureViewDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
               ,0x1ff,(char (*) [50])"\n                 Failed to create texture view \'",
               (char **)&msg,(char (*) [16])"\' for texture \'",(char **)TexDesc,
               (char (*) [4])"\': ",(char (*) [48])"For non-array texture FirstArraySlice must be 0"
              );
  }
  if (ViewDesc->TextureDim == RESOURCE_DIM_UNDEFINED) {
    if ((byte)(TexDesc->Type - RESOURCE_DIM_TEX_CUBE) < 2) {
      if (ViewDesc->ViewType - 2 < 4) {
        ViewDesc->TextureDim = RESOURCE_DIM_TEX_2D_ARRAY;
      }
      else {
        if (ViewDesc->ViewType == TEXTURE_VIEW_SHADER_RESOURCE) goto LAB_004f743c;
        FormatString<char[21]>(&msg,(char (*) [21])"Unexpected view type");
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"ValidatedAndCorrectTextureViewDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                   ,0x213);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
    }
    else {
LAB_004f743c:
      ViewDesc->TextureDim = TexDesc->Type;
    }
  }
  switch(TexDesc->Type) {
  case RESOURCE_DIM_TEX_1D:
    if (ViewDesc->TextureDim != RESOURCE_DIM_TEX_1D) {
      pcVar6 = (ViewDesc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar6 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar6;
      }
      pcVar6 = "Incorrect texture type for Texture 1D view: only Texture 1D is allowed.";
      Line = 0x221;
LAB_004f7506:
      LogError<true,char[50],char_const*,char[16],char_const*,char[4],char[72]>
                (false,"ValidatedAndCorrectTextureViewDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,Line,(char (*) [50])"\n                 Failed to create texture view \'",
                 (char **)&msg,(char (*) [16])"\' for texture \'",(char **)TexDesc,
                 (char (*) [4])"\': ",(char (*) [72])pcVar6);
    }
    break;
  case RESOURCE_DIM_TEX_1D_ARRAY:
    if ((ViewDesc->TextureDim & ~RESOURCE_DIM_BUFFER) != RESOURCE_DIM_TEX_1D) {
      pcVar6 = (ViewDesc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar6 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar6;
      }
      LogError<true,char[50],char_const*,char[16],char_const*,char[4],char[91]>
                (false,"ValidatedAndCorrectTextureViewDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x229,(char (*) [50])"\n                 Failed to create texture view \'",
                 (char **)&msg,(char (*) [16])"\' for texture \'",(char **)TexDesc,
                 (char (*) [4])"\': ",
                 (char (*) [91])
                 "Incorrect view type for Texture 1D Array: only Texture 1D or Texture 1D Array are allowed."
                );
    }
    break;
  case RESOURCE_DIM_TEX_2D:
    if ((ViewDesc->TextureDim & ~RESOURCE_DIM_BUFFER) != RESOURCE_DIM_TEX_2D) {
      pcVar6 = (ViewDesc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar6 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar6;
      }
      LogError<true,char[50],char_const*,char[16],char_const*,char[4],char[93]>
                (false,"ValidatedAndCorrectTextureViewDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x231,(char (*) [50])"\n                 Failed to create texture view \'",
                 (char **)&msg,(char (*) [16])"\' for texture \'",(char **)TexDesc,
                 (char (*) [4])"\': ",
                 (char (*) [93])
                 "Incorrect texture type for Texture 2D view: only Texture 2D or Texture 2D Array are allowed."
                );
    }
    break;
  case RESOURCE_DIM_TEX_2D_ARRAY:
    if ((ViewDesc->TextureDim & ~RESOURCE_DIM_BUFFER) != RESOURCE_DIM_TEX_2D) {
      pcVar6 = (ViewDesc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar6 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar6;
      }
      LogError<true,char[50],char_const*,char[16],char_const*,char[4],char[99]>
                (false,"ValidatedAndCorrectTextureViewDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x239,(char (*) [50])"\n                 Failed to create texture view \'",
                 (char **)&msg,(char (*) [16])"\' for texture \'",(char **)TexDesc,
                 (char (*) [4])"\': ",
                 (char (*) [99])
                 "Incorrect texture type for Texture 2D Array view: only Texture 2D or Texture 2D Array are allowed."
                );
    }
    break;
  case RESOURCE_DIM_TEX_3D:
    if (ViewDesc->TextureDim != RESOURCE_DIM_TEX_3D) {
      pcVar6 = (ViewDesc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar6 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar6;
      }
      pcVar6 = "Incorrect texture type for Texture 3D view: only Texture 3D is allowed.";
      Line = 0x240;
      goto LAB_004f7506;
    }
    break;
  case RESOURCE_DIM_TEX_CUBE:
    RVar1 = ViewDesc->TextureDim;
    if (ViewDesc->ViewType == TEXTURE_VIEW_SHADER_RESOURCE) {
      if ((7 < RVar1) || ((0xb0U >> (RVar1 & 0x1f) & 1) == 0)) {
        pcVar6 = (ViewDesc->super_DeviceObjectAttribs).Name;
        msg._M_dataplus._M_p = "";
        if (pcVar6 != (char *)0x0) {
          msg._M_dataplus._M_p = pcVar6;
        }
        LogError<true,char[50],char_const*,char[16],char_const*,char[4],char[102]>
                  (false,"ValidatedAndCorrectTextureViewDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                   ,0x24b,(char (*) [50])"\n                 Failed to create texture view \'",
                   (char **)&msg,(char (*) [16])"\' for texture \'",(char **)TexDesc,
                   (char (*) [4])"\': ",
                   (char (*) [102])
                   "Incorrect texture type for Texture cube SRV: Texture 2D, Texture 2D array or Texture Cube is allowed."
                  );
      }
    }
    else if ((RVar1 & ~RESOURCE_DIM_BUFFER) != RESOURCE_DIM_TEX_2D) {
      pcVar6 = (ViewDesc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar6 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar6;
      }
      LogError<true,char[50],char_const*,char[16],char_const*,char[4],char[109]>
                (false,"ValidatedAndCorrectTextureViewDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x253,(char (*) [50])"\n                 Failed to create texture view \'",
                 (char **)&msg,(char (*) [16])"\' for texture \'",(char **)TexDesc,
                 (char (*) [4])"\': ",
                 (char (*) [109])
                 "Incorrect texture type for Texture cube non-shader resource view: Texture 2D or Texture 2D array is allowed."
                );
    }
    break;
  case RESOURCE_DIM_TEX_CUBE_ARRAY:
    RVar1 = ViewDesc->TextureDim;
    if (ViewDesc->ViewType == TEXTURE_VIEW_SHADER_RESOURCE) {
      if ((8 < RVar1) || ((0x1b0U >> (RVar1 & 0x1f) & 1) == 0)) {
        pcVar6 = (ViewDesc->super_DeviceObjectAttribs).Name;
        msg._M_dataplus._M_p = "";
        if (pcVar6 != (char *)0x0) {
          msg._M_dataplus._M_p = pcVar6;
        }
        LogError<true,char[50],char_const*,char[16],char_const*,char[4],char[128]>
                  (false,"ValidatedAndCorrectTextureViewDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                   ,0x260,(char (*) [50])"\n                 Failed to create texture view \'",
                   (char **)&msg,(char (*) [16])"\' for texture \'",(char **)TexDesc,
                   (char (*) [4])"\': ",
                   (char (*) [128])
                   "Incorrect texture type for Texture cube array SRV: Texture 2D, Texture 2D array, Texture Cube or Texture Cube Array is allowed."
                  );
      }
    }
    else if ((RVar1 & ~RESOURCE_DIM_BUFFER) != RESOURCE_DIM_TEX_2D) {
      pcVar6 = (ViewDesc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar6 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar6;
      }
      LogError<true,char[50],char_const*,char[16],char_const*,char[4],char[115]>
                (false,"ValidatedAndCorrectTextureViewDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x268,(char (*) [50])"\n                 Failed to create texture view \'",
                 (char **)&msg,(char (*) [16])"\' for texture \'",(char **)TexDesc,
                 (char (*) [4])"\': ",
                 (char (*) [115])
                 "Incorrect texture type for Texture cube array non-shader resource view: Texture 2D or Texture 2D array is allowed."
                );
    }
    break;
  default:
    FormatString<char[24]>(&msg,(char (*) [24])"Unexpected texture type");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"ValidatedAndCorrectTextureViewDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
               ,0x26e);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  switch(ViewDesc->TextureDim) {
  case RESOURCE_DIM_TEX_1D:
  case RESOURCE_DIM_TEX_2D:
    if (2 < (ViewDesc->field_6).NumArraySlices + 1) {
      pcVar6 = (ViewDesc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar6 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar6;
      }
      LogError<true,char[50],char_const*,char[16],char_const*,char[4],char[31],unsigned_int,char[54]>
                (false,"ValidatedAndCorrectTextureViewDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x285,(char (*) [50])"\n                 Failed to create texture view \'",
                 (char **)&msg,(char (*) [16])"\' for texture \'",(char **)TexDesc,
                 (char (*) [4])"\': ",(char (*) [31])"Number of slices in the view (",
                 &(ViewDesc->field_6).NumArraySlices,
                 (char (*) [54])") must be 1 (or 0) for non-array texture 1D/2D views.");
    }
    break;
  case RESOURCE_DIM_TEX_1D_ARRAY:
  case RESOURCE_DIM_TEX_2D_ARRAY:
    break;
  case RESOURCE_DIM_TEX_3D:
    uVar5 = (TexDesc->field_3).ArraySize >> ((byte)ViewDesc->MostDetailedMip & 0x1f);
    uVar5 = uVar5 + (uVar5 == 0);
    _MipDepth = (char *)CONCAT44(uStack_3c,uVar5);
    if (uVar5 < (ViewDesc->field_6).NumArraySlices + (ViewDesc->field_5).FirstArraySlice) {
      pcVar6 = (ViewDesc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar6 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar6;
      }
      LogError<true,char[50],char_const*,char[16],char_const*,char[4],char[14],unsigned_int,char[37],unsigned_int,char[61],unsigned_int,char[3]>
                (false,"ValidatedAndCorrectTextureViewDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x290,(char (*) [50])"\n                 Failed to create texture view \'",
                 (char **)&msg,(char (*) [16])"\' for texture \'",(char **)TexDesc,
                 (char (*) [4])"\': ",(char (*) [14])"First slice (",
                 &(ViewDesc->field_5).FirstArraySlice,
                 (char (*) [37])") and number of slices in the view (",
                 &(ViewDesc->field_6).NumArraySlices,
                 (char (*) [61])") specify more slices than target 3D texture mip level has (",
                 &MipDepth,(char (*) [3])0x773e90);
    }
    break;
  case RESOURCE_DIM_TEX_CUBE:
    if (ViewDesc->ViewType != TEXTURE_VIEW_SHADER_RESOURCE) {
      pcVar6 = (ViewDesc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar6 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar6;
      }
      LogError<true,char[50],char_const*,char[16],char_const*,char[4],char[39]>
                (false,"ValidatedAndCorrectTextureViewDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x276,(char (*) [50])"\n                 Failed to create texture view \'",
                 (char **)&msg,(char (*) [16])"\' for texture \'",(char **)TexDesc,
                 (char (*) [4])"\': ",(char (*) [39])"Unexpected view type: SRV is expected.");
    }
    uVar5 = (ViewDesc->field_6).NumArraySlices + 1;
    if ((7 < uVar5) || ((0x83U >> (uVar5 & 0x1f) & 1) == 0)) {
      pcVar6 = (ViewDesc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar6 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar6;
      }
      LogError<true,char[50],char_const*,char[16],char_const*,char[4],char[60],unsigned_int,char[14]>
                (false,"ValidatedAndCorrectTextureViewDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x278,(char (*) [50])"\n                 Failed to create texture view \'",
                 (char **)&msg,(char (*) [16])"\' for texture \'",(char **)TexDesc,
                 (char (*) [4])"\': ",
                 (char (*) [60])"Texture cube SRV is expected to have 6 array slices, while ",
                 &(ViewDesc->field_6).NumArraySlices,(char (*) [14])0x77451a);
    }
    break;
  case RESOURCE_DIM_TEX_CUBE_ARRAY:
    if (ViewDesc->ViewType != TEXTURE_VIEW_SHADER_RESOURCE) {
      pcVar6 = (ViewDesc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar6 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar6;
      }
      LogError<true,char[50],char_const*,char[16],char_const*,char[4],char[39]>
                (false,"ValidatedAndCorrectTextureViewDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x27d,(char (*) [50])"\n                 Failed to create texture view \'",
                 (char **)&msg,(char (*) [16])"\' for texture \'",(char **)TexDesc,
                 (char (*) [4])"\': ",(char (*) [39])"Unexpected view type: SRV is expected.");
    }
    if (((ViewDesc->field_6).NumArraySlices != 0xffffffff) &&
       ((ViewDesc->field_6).NumArraySlices % 6 != 0)) {
      pcVar6 = (ViewDesc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar6 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar6;
      }
      LogError<true,char[50],char_const*,char[16],char_const*,char[4],char[77],unsigned_int,char[21]>
                (false,"ValidatedAndCorrectTextureViewDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x27f,(char (*) [50])"\n                 Failed to create texture view \'",
                 (char **)&msg,(char (*) [16])"\' for texture \'",(char **)TexDesc,
                 (char (*) [4])"\': ",
                 (char (*) [77])
                 "Number of slices in texture cube array SRV is expected to be multiple of 6. ",
                 &(ViewDesc->field_6).NumArraySlices,(char (*) [21])" slices is provided.");
    }
    break;
  default:
    FormatString<char[29]>(&msg,(char (*) [29])"Unexpected texture dimension");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"ValidatedAndCorrectTextureViewDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
               ,0x295);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  pTVar7 = GetTextureFormatAttribs(ViewDesc->Format);
  if (pTVar7->IsTypeless == true) {
    pcVar6 = (ViewDesc->super_DeviceObjectAttribs).Name;
    msg._M_dataplus._M_p = "";
    if (pcVar6 != (char *)0x0) {
      msg._M_dataplus._M_p = pcVar6;
    }
    pTVar7 = GetTextureFormatAttribs(ViewDesc->Format);
    LogError<true,char[50],char_const*,char[16],char_const*,char[4],char[22],char_const*,char[22]>
              (false,"ValidatedAndCorrectTextureViewDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
               ,0x29a,(char (*) [50])"\n                 Failed to create texture view \'",
               (char **)&msg,(char (*) [16])"\' for texture \'",(char **)TexDesc,
               (char (*) [4])"\': ",(char (*) [22])"Texture view format (",&pTVar7->Name,
               (char (*) [22])") cannot be typeless.");
  }
  if ((ViewDesc->Flags & TEXTURE_VIEW_FLAG_ALLOW_MIP_MAP_GENERATION) != TEXTURE_VIEW_FLAG_NONE) {
    if ((TexDesc->MiscFlags & MISC_TEXTURE_FLAG_GENERATE_MIPS) == MISC_TEXTURE_FLAG_NONE) {
      pcVar6 = (ViewDesc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar6 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar6;
      }
      LogError<true,char[50],char_const*,char[16],char_const*,char[4],char[131]>
                (false,"ValidatedAndCorrectTextureViewDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x2a0,(char (*) [50])"\n                 Failed to create texture view \'",
                 (char **)&msg,(char (*) [16])"\' for texture \'",(char **)TexDesc,
                 (char (*) [4])"\': ",
                 (char (*) [131])
                 "TEXTURE_VIEW_FLAG_ALLOW_MIP_MAP_GENERATION flag can only set if the texture was created with MISC_TEXTURE_FLAG_GENERATE_MIPS flag."
                );
    }
    if (ViewDesc->ViewType != TEXTURE_VIEW_SHADER_RESOURCE) {
      pcVar6 = (ViewDesc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar6 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar6;
      }
      LogError<true,char[50],char_const*,char[16],char_const*,char[4],char[110]>
                (false,"ValidatedAndCorrectTextureViewDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x2a3,(char (*) [50])"\n                 Failed to create texture view \'",
                 (char **)&msg,(char (*) [16])"\' for texture \'",(char **)TexDesc,
                 (char (*) [4])"\': ",
                 (char (*) [110])
                 "TEXTURE_VIEW_FLAG_ALLOW_MIP_MAP_GENERATION flag can only be used with TEXTURE_VIEW_SHADER_RESOURCE view type."
                );
    }
  }
  if ((ViewDesc->ViewType == TEXTURE_VIEW_SHADING_RATE) &&
     ((TexDesc->BindFlags & BIND_FLAG_LAST) == BIND_NONE)) {
    pcVar6 = (ViewDesc->super_DeviceObjectAttribs).Name;
    msg._M_dataplus._M_p = "";
    if (pcVar6 != (char *)0x0) {
      msg._M_dataplus._M_p = pcVar6;
    }
    LogError<true,char[50],char_const*,char[16],char_const*,char[4],char[94]>
              (false,"ValidatedAndCorrectTextureViewDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
               ,0x2a9,(char (*) [50])"\n                 Failed to create texture view \'",
               (char **)&msg,(char (*) [16])"\' for texture \'",(char **)TexDesc,
               (char (*) [4])"\': ",
               (char (*) [94])
               "To create TEXTURE_VIEW_SHADING_RATE, the texture must be created with BIND_SHADING_RATE flag."
              );
  }
  if ((ViewDesc->ViewType != TEXTURE_VIEW_SHADER_RESOURCE) &&
     (bVar2 = IsIdentityComponentMapping(&ViewDesc->Swizzle), !bVar2)) {
    pcVar6 = (ViewDesc->super_DeviceObjectAttribs).Name;
    msg._M_dataplus._M_p = "";
    if (pcVar6 != (char *)0x0) {
      msg._M_dataplus._M_p = pcVar6;
    }
    LogError<true,char[50],char_const*,char[16],char_const*,char[4],char[84]>
              (false,"ValidatedAndCorrectTextureViewDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
               ,0x2ad,(char (*) [50])"\n                 Failed to create texture view \'",
               (char **)&msg,(char (*) [16])"\' for texture \'",(char **)TexDesc,
               (char (*) [4])"\': ",
               (char (*) [84])
               "Non-identity texture component swizzle is only supported for shader resource views."
              );
  }
  if (*local_38 + 1 < 2) {
    UVar4 = 1;
    if (ViewDesc->ViewType == TEXTURE_VIEW_SHADER_RESOURCE) {
      UVar4 = *Args_8 - ViewDesc->MostDetailedMip;
    }
    ViewDesc->NumMipLevels = UVar4;
  }
  if (1 < (ViewDesc->field_6).NumArraySlices + 1) goto LAB_004f7e17;
  RVar1 = TexDesc->Type;
  UVar4 = 1;
  if (RVar1 < 9) {
    if ((0x1a8U >> (RVar1 & 0x1f) & 1) == 0) {
      if (RVar1 != RESOURCE_DIM_TEX_3D) goto LAB_004f7e14;
      uVar5 = (TexDesc->field_3).ArraySize >> ((byte)ViewDesc->MostDetailedMip & 0x1f);
      UVar4 = uVar5 + (uVar5 == 0);
    }
    else {
      UVar4 = (TexDesc->field_3).ArraySize;
    }
    UVar4 = UVar4 - (ViewDesc->field_5).FirstArraySlice;
  }
LAB_004f7e14:
  (ViewDesc->field_6).NumArraySlices = UVar4;
LAB_004f7e17:
  if (ViewDesc->ViewType == TEXTURE_VIEW_RENDER_TARGET) {
    TVar3 = ViewDesc->Format;
    if (((ulong)TVar3 < 0x40) &&
       (Args_1 = (char (*) [194])0x8408002080002000,
       (0x8408002080002000U >> ((ulong)TVar3 & 0x3f) & 1) != 0)) {
      pTVar7 = GetTextureFormatAttribs(TVar3);
      _MipDepth = pTVar7->Name;
      FormatString<char_const*,char[194]>
                (&msg,(Diligent *)&MipDepth,
                 (char **)
                 " render target view is created.\nThere might be an issue in OpenGL driver on NVidia hardware: when rendering to SNORM textures, all negative values are clamped to zero.\nUse UNORM format instead."
                 ,Args_1);
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(1,msg._M_dataplus._M_p,0,0,0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

void ValidatedAndCorrectTextureViewDesc(const TextureDesc& TexDesc, TextureViewDesc& ViewDesc) noexcept(false)
{
#define TEX_VIEW_VALIDATION_ERROR(...) LOG_ERROR_AND_THROW("\n                 Failed to create texture view '", (ViewDesc.Name ? ViewDesc.Name : ""), "' for texture '", TexDesc.Name, "': ", ##__VA_ARGS__)

    if (!(ViewDesc.ViewType > TEXTURE_VIEW_UNDEFINED && ViewDesc.ViewType < TEXTURE_VIEW_NUM_VIEWS))
        TEX_VIEW_VALIDATION_ERROR("Texture view type is not specified.");

    if (ViewDesc.MostDetailedMip >= TexDesc.MipLevels)
        TEX_VIEW_VALIDATION_ERROR("Most detailed mip (", ViewDesc.MostDetailedMip, ") is out of range. The texture has only ", TexDesc.MipLevels, " mip ", (TexDesc.MipLevels > 1 ? "levels." : "level."));

    if (ViewDesc.NumMipLevels != REMAINING_MIP_LEVELS && ViewDesc.MostDetailedMip + ViewDesc.NumMipLevels > TexDesc.MipLevels)
        TEX_VIEW_VALIDATION_ERROR("Most detailed mip (", ViewDesc.MostDetailedMip, ") and number of mip levels in the view (", ViewDesc.NumMipLevels, ") is out of range. The texture has only ", TexDesc.MipLevels, " mip ", (TexDesc.MipLevels > 1 ? "levels." : "level."));

    if (ViewDesc.Format == TEX_FORMAT_UNKNOWN)
        ViewDesc.Format = GetDefaultTextureViewFormat(TexDesc.Format, ViewDesc.ViewType, TexDesc.BindFlags);

    if (TexDesc.IsArray())
    {
        if (ViewDesc.FirstArraySlice >= TexDesc.ArraySize)
            TEX_VIEW_VALIDATION_ERROR("First array slice (", ViewDesc.FirstArraySlice, ") is out of range. The texture has only (", TexDesc.ArraySize, ") slices.");

        if (ViewDesc.NumArraySlices != REMAINING_ARRAY_SLICES && ViewDesc.FirstArraySlice + ViewDesc.NumArraySlices > TexDesc.ArraySize)
            TEX_VIEW_VALIDATION_ERROR("First array slice (", ViewDesc.FirstArraySlice, ") and number of array slices (", ViewDesc.NumArraySlices,
                                      ") is out of range. The texture has only (", TexDesc.ArraySize, ") slices.");
    }
    else if (!TexDesc.Is3D())
    {
        if (ViewDesc.FirstArraySlice != 0)
            TEX_VIEW_VALIDATION_ERROR("For non-array texture FirstArraySlice must be 0");
    }

    if (ViewDesc.TextureDim == RESOURCE_DIM_UNDEFINED)
    {
        if (TexDesc.Type == RESOURCE_DIM_TEX_CUBE || TexDesc.Type == RESOURCE_DIM_TEX_CUBE_ARRAY)
        {
            switch (ViewDesc.ViewType)
            {
                case TEXTURE_VIEW_SHADER_RESOURCE:
                    ViewDesc.TextureDim = TexDesc.Type;
                    break;

                case TEXTURE_VIEW_RENDER_TARGET:
                case TEXTURE_VIEW_DEPTH_STENCIL:
                case TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL:
                case TEXTURE_VIEW_UNORDERED_ACCESS:
                    ViewDesc.TextureDim = RESOURCE_DIM_TEX_2D_ARRAY;
                    break;

                default: UNEXPECTED("Unexpected view type");
            }
        }
        else
        {
            ViewDesc.TextureDim = TexDesc.Type;
        }
    }

    switch (TexDesc.Type)
    {
        case RESOURCE_DIM_TEX_1D:
            if (ViewDesc.TextureDim != RESOURCE_DIM_TEX_1D)
            {
                TEX_VIEW_VALIDATION_ERROR("Incorrect texture type for Texture 1D view: only Texture 1D is allowed.");
            }
            break;

        case RESOURCE_DIM_TEX_1D_ARRAY:
            if (ViewDesc.TextureDim != RESOURCE_DIM_TEX_1D_ARRAY &&
                ViewDesc.TextureDim != RESOURCE_DIM_TEX_1D)
            {
                TEX_VIEW_VALIDATION_ERROR("Incorrect view type for Texture 1D Array: only Texture 1D or Texture 1D Array are allowed.");
            }
            break;

        case RESOURCE_DIM_TEX_2D:
            if (ViewDesc.TextureDim != RESOURCE_DIM_TEX_2D_ARRAY &&
                ViewDesc.TextureDim != RESOURCE_DIM_TEX_2D)
            {
                TEX_VIEW_VALIDATION_ERROR("Incorrect texture type for Texture 2D view: only Texture 2D or Texture 2D Array are allowed.");
            }
            break;

        case RESOURCE_DIM_TEX_2D_ARRAY:
            if (ViewDesc.TextureDim != RESOURCE_DIM_TEX_2D_ARRAY &&
                ViewDesc.TextureDim != RESOURCE_DIM_TEX_2D)
            {
                TEX_VIEW_VALIDATION_ERROR("Incorrect texture type for Texture 2D Array view: only Texture 2D or Texture 2D Array are allowed.");
            }
            break;

        case RESOURCE_DIM_TEX_3D:
            if (ViewDesc.TextureDim != RESOURCE_DIM_TEX_3D)
            {
                TEX_VIEW_VALIDATION_ERROR("Incorrect texture type for Texture 3D view: only Texture 3D is allowed.");
            }
            break;

        case RESOURCE_DIM_TEX_CUBE:
            if (ViewDesc.ViewType == TEXTURE_VIEW_SHADER_RESOURCE)
            {
                if (ViewDesc.TextureDim != RESOURCE_DIM_TEX_2D &&
                    ViewDesc.TextureDim != RESOURCE_DIM_TEX_2D_ARRAY &&
                    ViewDesc.TextureDim != RESOURCE_DIM_TEX_CUBE)
                {
                    TEX_VIEW_VALIDATION_ERROR("Incorrect texture type for Texture cube SRV: Texture 2D, Texture 2D array or Texture Cube is allowed.");
                }
            }
            else
            {
                if (ViewDesc.TextureDim != RESOURCE_DIM_TEX_2D &&
                    ViewDesc.TextureDim != RESOURCE_DIM_TEX_2D_ARRAY)
                {
                    TEX_VIEW_VALIDATION_ERROR("Incorrect texture type for Texture cube non-shader resource view: Texture 2D or Texture 2D array is allowed.");
                }
            }
            break;

        case RESOURCE_DIM_TEX_CUBE_ARRAY:
            if (ViewDesc.ViewType == TEXTURE_VIEW_SHADER_RESOURCE)
            {
                if (ViewDesc.TextureDim != RESOURCE_DIM_TEX_2D &&
                    ViewDesc.TextureDim != RESOURCE_DIM_TEX_2D_ARRAY &&
                    ViewDesc.TextureDim != RESOURCE_DIM_TEX_CUBE &&
                    ViewDesc.TextureDim != RESOURCE_DIM_TEX_CUBE_ARRAY)
                {
                    TEX_VIEW_VALIDATION_ERROR("Incorrect texture type for Texture cube array SRV: Texture 2D, Texture 2D array, Texture Cube or Texture Cube Array is allowed.");
                }
            }
            else
            {
                if (ViewDesc.TextureDim != RESOURCE_DIM_TEX_2D &&
                    ViewDesc.TextureDim != RESOURCE_DIM_TEX_2D_ARRAY)
                {
                    TEX_VIEW_VALIDATION_ERROR("Incorrect texture type for Texture cube array non-shader resource view: Texture 2D or Texture 2D array is allowed.");
                }
            }
            break;

        default:
            UNEXPECTED("Unexpected texture type");
            break;
    }

    switch (ViewDesc.TextureDim)
    {
        case RESOURCE_DIM_TEX_CUBE:
            if (ViewDesc.ViewType != TEXTURE_VIEW_SHADER_RESOURCE)
                TEX_VIEW_VALIDATION_ERROR("Unexpected view type: SRV is expected.");
            if (ViewDesc.NumArraySlices != 6 && ViewDesc.NumArraySlices != 0 && ViewDesc.NumArraySlices != REMAINING_ARRAY_SLICES)
                TEX_VIEW_VALIDATION_ERROR("Texture cube SRV is expected to have 6 array slices, while ", ViewDesc.NumArraySlices, " is provided.");
            break;

        case RESOURCE_DIM_TEX_CUBE_ARRAY:
            if (ViewDesc.ViewType != TEXTURE_VIEW_SHADER_RESOURCE)
                TEX_VIEW_VALIDATION_ERROR("Unexpected view type: SRV is expected.");
            if (ViewDesc.NumArraySlices != REMAINING_ARRAY_SLICES && (ViewDesc.NumArraySlices % 6) != 0)
                TEX_VIEW_VALIDATION_ERROR("Number of slices in texture cube array SRV is expected to be multiple of 6. ", ViewDesc.NumArraySlices, " slices is provided.");
            break;

        case RESOURCE_DIM_TEX_1D:
        case RESOURCE_DIM_TEX_2D:
            if (ViewDesc.NumArraySlices != REMAINING_ARRAY_SLICES && ViewDesc.NumArraySlices > 1)
                TEX_VIEW_VALIDATION_ERROR("Number of slices in the view (", ViewDesc.NumArraySlices, ") must be 1 (or 0) for non-array texture 1D/2D views.");
            break;

        case RESOURCE_DIM_TEX_1D_ARRAY:
        case RESOURCE_DIM_TEX_2D_ARRAY:
            break;

        case RESOURCE_DIM_TEX_3D:
        {
            Uint32 MipDepth = std::max(TexDesc.Depth >> ViewDesc.MostDetailedMip, 1u);
            if (ViewDesc.FirstDepthSlice + ViewDesc.NumDepthSlices > MipDepth)
                TEX_VIEW_VALIDATION_ERROR("First slice (", ViewDesc.FirstDepthSlice, ") and number of slices in the view (", ViewDesc.NumDepthSlices, ") specify more slices than target 3D texture mip level has (", MipDepth, ").");
            break;
        }

        default:
            UNEXPECTED("Unexpected texture dimension");
    }

    if (GetTextureFormatAttribs(ViewDesc.Format).IsTypeless)
    {
        TEX_VIEW_VALIDATION_ERROR("Texture view format (", GetTextureFormatAttribs(ViewDesc.Format).Name, ") cannot be typeless.");
    }

    if ((ViewDesc.Flags & TEXTURE_VIEW_FLAG_ALLOW_MIP_MAP_GENERATION) != 0)
    {
        if ((TexDesc.MiscFlags & MISC_TEXTURE_FLAG_GENERATE_MIPS) == 0)
            TEX_VIEW_VALIDATION_ERROR("TEXTURE_VIEW_FLAG_ALLOW_MIP_MAP_GENERATION flag can only set if the texture was created with MISC_TEXTURE_FLAG_GENERATE_MIPS flag.");

        if (ViewDesc.ViewType != TEXTURE_VIEW_SHADER_RESOURCE)
            TEX_VIEW_VALIDATION_ERROR("TEXTURE_VIEW_FLAG_ALLOW_MIP_MAP_GENERATION flag can only be used with TEXTURE_VIEW_SHADER_RESOURCE view type.");
    }

    if (ViewDesc.ViewType == TEXTURE_VIEW_SHADING_RATE)
    {
        if ((TexDesc.BindFlags & BIND_SHADING_RATE) == 0)
            TEX_VIEW_VALIDATION_ERROR("To create TEXTURE_VIEW_SHADING_RATE, the texture must be created with BIND_SHADING_RATE flag.");
    }

    if (ViewDesc.ViewType != TEXTURE_VIEW_SHADER_RESOURCE && !IsIdentityComponentMapping(ViewDesc.Swizzle))
        TEX_VIEW_VALIDATION_ERROR("Non-identity texture component swizzle is only supported for shader resource views.");

#undef TEX_VIEW_VALIDATION_ERROR

    if (ViewDesc.NumMipLevels == 0 || ViewDesc.NumMipLevels == REMAINING_MIP_LEVELS)
    {
        if (ViewDesc.ViewType == TEXTURE_VIEW_SHADER_RESOURCE)
            ViewDesc.NumMipLevels = TexDesc.MipLevels - ViewDesc.MostDetailedMip;
        else
            ViewDesc.NumMipLevels = 1;
    }

    if (ViewDesc.NumArraySlices == 0 || ViewDesc.NumArraySlices == REMAINING_ARRAY_SLICES)
    {
        if (TexDesc.IsArray())
            ViewDesc.NumArraySlices = TexDesc.ArraySize - ViewDesc.FirstArraySlice;
        else if (TexDesc.Is3D())
        {
            Uint32 MipDepth         = std::max(TexDesc.Depth >> ViewDesc.MostDetailedMip, 1u);
            ViewDesc.NumDepthSlices = MipDepth - ViewDesc.FirstDepthSlice;
        }
        else
            ViewDesc.NumArraySlices = 1;
    }

    if ((ViewDesc.ViewType == TEXTURE_VIEW_RENDER_TARGET) &&
        (ViewDesc.Format == TEX_FORMAT_R8_SNORM || ViewDesc.Format == TEX_FORMAT_RG8_SNORM || ViewDesc.Format == TEX_FORMAT_RGBA8_SNORM ||
         ViewDesc.Format == TEX_FORMAT_R16_SNORM || ViewDesc.Format == TEX_FORMAT_RG16_SNORM || ViewDesc.Format == TEX_FORMAT_RGBA16_SNORM))
    {
        const char* FmtName = GetTextureFormatAttribs(ViewDesc.Format).Name;
        LOG_WARNING_MESSAGE(FmtName, " render target view is created.\n"
                                     "There might be an issue in OpenGL driver on NVidia hardware: when rendering to SNORM textures, all negative values are clamped to zero.\n"
                                     "Use UNORM format instead.");
    }
}